

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::ProcessRequest(cmServer *this,cmConnection *connection,string *input)

{
  bool bVar1;
  Value *pVVar2;
  pointer pDVar3;
  cmake *this_00;
  cmServerResponse local_478;
  cmServerResponse local_3e8;
  allocator local_351;
  string local_350;
  undefined1 local_330 [8];
  cmServerResponse response;
  string local_280;
  undefined1 local_260 [8];
  cmServerRequest request;
  unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> local_1c8;
  undefined1 local_1c0 [8];
  Value debugValue;
  unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> debug;
  string local_188;
  undefined1 local_158 [8];
  Value value;
  Reader reader;
  string *input_local;
  cmConnection *connection_local;
  cmServer *this_local;
  
  Json::Reader::Reader((Reader *)&value.limit_);
  Json::Value::Value((Value *)local_158,nullValue);
  bVar1 = Json::Reader::parse((Reader *)&value.limit_,input,(Value *)local_158,true);
  if (bVar1) {
    std::unique_ptr<cmServer::DebugInfo,std::default_delete<cmServer::DebugInfo>>::
    unique_ptr<std::default_delete<cmServer::DebugInfo>,void>
              ((unique_ptr<cmServer::DebugInfo,std::default_delete<cmServer::DebugInfo>> *)
               &debugValue.limit_);
    pVVar2 = Json::Value::operator[]((Value *)local_158,"debug");
    Json::Value::Value((Value *)local_1c0,pVVar2);
    bVar1 = Json::Value::isNull((Value *)local_1c0);
    if (!bVar1) {
      std::make_unique<cmServer::DebugInfo>();
      std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::operator=
                ((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
                 &debugValue.limit_,&local_1c8);
      std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::~unique_ptr
                (&local_1c8);
      pVVar2 = Json::Value::operator[]((Value *)local_1c0,"dumpToFile");
      Json::Value::asString_abi_cxx11_((string *)&request.m_Server,pVVar2);
      pDVar3 = std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::
               operator->((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                           *)&debugValue.limit_);
      std::__cxx11::string::operator=((string *)&pDVar3->OutputFile,(string *)&request.m_Server);
      std::__cxx11::string::~string((string *)&request.m_Server);
      pVVar2 = Json::Value::operator[]((Value *)local_1c0,"showStats");
      bVar1 = Json::Value::asBool(pVVar2);
      pDVar3 = std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::
               operator->((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                           *)&debugValue.limit_);
      pDVar3->PrintStatistics = bVar1;
    }
    pVVar2 = Json::Value::operator[]((Value *)local_158,&kTYPE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_280,pVVar2);
    pVVar2 = Json::Value::operator[]((Value *)local_158,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_((string *)&response.m_Data.limit_,pVVar2);
    cmServerRequest::cmServerRequest
              ((cmServerRequest *)local_260,this,connection,&local_280,
               (string *)&response.m_Data.limit_,(Value *)local_158);
    std::__cxx11::string::~string((string *)&response.m_Data.limit_);
    std::__cxx11::string::~string((string *)&local_280);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_260,"");
    if (bVar1) {
      cmServerResponse::cmServerResponse((cmServerResponse *)local_330,(cmServerRequest *)local_260)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_350,"No type given in request.",&local_351);
      cmServerResponse::SetError((cmServerResponse *)local_330,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      WriteResponse(this,connection,(cmServerResponse *)local_330,(DebugInfo *)0x0);
      debug._M_t.
      super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>._M_t.
      super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>.
      super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl._0_4_ = 1;
      cmServerResponse::~cmServerResponse((cmServerResponse *)local_330);
    }
    else {
      cmSystemTools::SetMessageCallback(reportMessage,local_260);
      if (this->Protocol == (cmServerProtocol *)0x0) {
        SetProtocolVersion(&local_478,this,(cmServerRequest *)local_260);
        pDVar3 = std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::
                 get((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
                     &debugValue.limit_);
        WriteResponse(this,connection,&local_478,pDVar3);
        cmServerResponse::~cmServerResponse(&local_478);
      }
      else {
        this_00 = cmServerProtocol::CMakeInstance(this->Protocol);
        cmake::SetProgressCallback(this_00,reportProgress,local_260);
        (*this->Protocol->_vptr_cmServerProtocol[4])(&local_3e8,this->Protocol,local_260);
        pDVar3 = std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::
                 get((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
                     &debugValue.limit_);
        WriteResponse(this,connection,&local_3e8,pDVar3);
        cmServerResponse::~cmServerResponse(&local_3e8);
      }
      debug._M_t.
      super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>._M_t.
      super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>.
      super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl._0_4_ = 0;
    }
    cmServerRequest::~cmServerRequest((cmServerRequest *)local_260);
    Json::Value::~Value((Value *)local_1c0);
    std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::~unique_ptr
              ((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
               &debugValue.limit_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_188,"Failed to parse JSON input.",
               (allocator *)
               ((long)&debug._M_t.
                       super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
                       .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl + 7));
    WriteParseError(this,connection,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&debug._M_t.
                       super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
                       .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl + 7));
    debug._M_t.super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
    ._M_t.super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>.
    super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl._0_4_ = 1;
  }
  Json::Value::~Value((Value *)local_158);
  Json::Reader::~Reader((Reader *)&value.limit_);
  return;
}

Assistant:

void cmServer::ProcessRequest(cmConnection* connection,
                              const std::string& input)
{
  Json::Reader reader;
  Json::Value value;
  if (!reader.parse(input, value)) {
    this->WriteParseError(connection, "Failed to parse JSON input.");
    return;
  }

  std::unique_ptr<DebugInfo> debug;
  Json::Value debugValue = value["debug"];
  if (!debugValue.isNull()) {
    debug = std::make_unique<DebugInfo>();
    debug->OutputFile = debugValue["dumpToFile"].asString();
    debug->PrintStatistics = debugValue["showStats"].asBool();
  }

  const cmServerRequest request(this, connection, value[kTYPE_KEY].asString(),
                                value[kCOOKIE_KEY].asString(), value);

  if (request.Type == "") {
    cmServerResponse response(request);
    response.SetError("No type given in request.");
    this->WriteResponse(connection, response, nullptr);
    return;
  }

  cmSystemTools::SetMessageCallback(reportMessage,
                                    const_cast<cmServerRequest*>(&request));
  if (this->Protocol) {
    this->Protocol->CMakeInstance()->SetProgressCallback(
      reportProgress, const_cast<cmServerRequest*>(&request));
    this->WriteResponse(connection, this->Protocol->Process(request),
                        debug.get());
  } else {
    this->WriteResponse(connection, this->SetProtocolVersion(request),
                        debug.get());
  }
}